

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-pile.c
# Opt level: O0

void pile_insert(object **pile,object *obj)

{
  object *obj_local;
  object **pile_local;
  
  if ((obj->prev != (object *)0x0) || (obj->next != (object *)0x0)) {
    pile_integrity_fail((object *)0x0,obj,
                        "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/obj-pile.c"
                        ,L'ª');
  }
  if (*pile != (object *)0x0) {
    obj->next = *pile;
    (*pile)->prev = obj;
  }
  *pile = obj;
  pile_check_integrity("insert",*pile,obj);
  return;
}

Assistant:

void pile_insert(struct object **pile, struct object *obj)
{
	if (obj->prev || obj->next) {
		pile_integrity_fail(NULL, obj, __FILE__, __LINE__);
	}

	if (*pile) {
		obj->next = *pile;
		(*pile)->prev = obj;
	}

	*pile = obj;

	pile_check_integrity("insert", *pile, obj);
}